

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

BitWidth flexbuffers::Builder::WidthB(size_t byte_width)

{
  if ((byte_width - 1 < 8) && ((0x8bU >> ((uint)(byte_width - 1) & 0x1f) & 1) != 0)) {
    return *(BitWidth *)
            ("Type flexbuffers::ToFixedTypedVectorElementType(Type, uint8_t *)" +
            byte_width * 4 + 0x3f);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5c5,"static BitWidth flexbuffers::Builder::WidthB(size_t)");
}

Assistant:

static BitWidth WidthB(size_t byte_width) {
    switch (byte_width) {
      case 1: return BIT_WIDTH_8;
      case 2: return BIT_WIDTH_16;
      case 4: return BIT_WIDTH_32;
      case 8: return BIT_WIDTH_64;
      default: FLATBUFFERS_ASSERT(false); return BIT_WIDTH_64;
    }
  }